

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__horizontal_gather_7_channels_with_7_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float *pfVar65;
  long lVar66;
  
  pfVar1 = output_buffer + output_sub_size * 7;
  pfVar65 = horizontal_coefficients + 4;
  do {
    lVar66 = (long)horizontal_contributors->n0;
    fVar9 = pfVar65[-4];
    fVar10 = pfVar65[-3];
    fVar11 = pfVar65[-2];
    fVar12 = pfVar65[-1];
    pfVar2 = decode_buffer + lVar66 * 7;
    fVar13 = *pfVar2;
    fVar14 = pfVar2[1];
    fVar15 = pfVar2[2];
    fVar16 = pfVar2[3];
    pfVar2 = decode_buffer + lVar66 * 7 + 3;
    fVar17 = pfVar2[1];
    fVar18 = pfVar2[2];
    fVar19 = pfVar2[3];
    pfVar3 = decode_buffer + lVar66 * 7 + 7;
    fVar20 = *pfVar3;
    fVar21 = pfVar3[1];
    fVar22 = pfVar3[2];
    fVar23 = pfVar3[3];
    pfVar3 = decode_buffer + lVar66 * 7 + 10;
    fVar24 = pfVar3[1];
    fVar25 = pfVar3[2];
    fVar26 = pfVar3[3];
    pfVar4 = decode_buffer + lVar66 * 7 + 0xe;
    fVar27 = *pfVar4;
    fVar28 = pfVar4[1];
    fVar29 = pfVar4[2];
    fVar30 = pfVar4[3];
    pfVar4 = decode_buffer + lVar66 * 7 + 0x11;
    fVar31 = pfVar4[1];
    fVar32 = pfVar4[2];
    fVar33 = pfVar4[3];
    pfVar5 = decode_buffer + lVar66 * 7 + 0x15;
    fVar34 = *pfVar5;
    fVar35 = pfVar5[1];
    fVar36 = pfVar5[2];
    fVar37 = pfVar5[3];
    pfVar5 = decode_buffer + lVar66 * 7 + 0x18;
    fVar38 = pfVar5[1];
    fVar39 = pfVar5[2];
    fVar40 = pfVar5[3];
    fVar41 = *pfVar65;
    fVar42 = pfVar65[1];
    fVar43 = pfVar65[2];
    pfVar6 = decode_buffer + lVar66 * 7 + 0x1c;
    fVar44 = *pfVar6;
    fVar45 = pfVar6[1];
    fVar46 = pfVar6[2];
    fVar47 = pfVar6[3];
    pfVar6 = decode_buffer + lVar66 * 7 + 0x1f;
    fVar48 = pfVar6[1];
    fVar49 = pfVar6[2];
    fVar50 = pfVar6[3];
    pfVar7 = decode_buffer + lVar66 * 7 + 0x23;
    fVar51 = *pfVar7;
    fVar52 = pfVar7[1];
    fVar53 = pfVar7[2];
    fVar54 = pfVar7[3];
    pfVar7 = decode_buffer + lVar66 * 7 + 0x26;
    fVar55 = pfVar7[1];
    fVar56 = pfVar7[2];
    fVar57 = pfVar7[3];
    pfVar8 = decode_buffer + lVar66 * 7 + 0x2a;
    fVar58 = *pfVar8;
    fVar59 = pfVar8[1];
    fVar60 = pfVar8[2];
    fVar61 = pfVar8[3];
    pfVar8 = decode_buffer + lVar66 * 7 + 0x2d;
    fVar62 = pfVar8[1];
    fVar63 = pfVar8[2];
    fVar64 = pfVar8[3];
    output_buffer[3] =
         *pfVar8 * fVar43 + *pfVar6 * fVar41 + *pfVar4 * fVar11 + *pfVar2 * fVar9 +
         fVar42 * *pfVar7 + *pfVar5 * fVar12 + fVar10 * *pfVar3;
    output_buffer[4] =
         fVar62 * fVar43 + fVar48 * fVar41 + fVar31 * fVar11 + fVar17 * fVar9 +
         fVar42 * fVar55 + fVar38 * fVar12 + fVar10 * fVar24;
    output_buffer[5] =
         fVar63 * fVar43 + fVar49 * fVar41 + fVar32 * fVar11 + fVar18 * fVar9 +
         fVar42 * fVar56 + fVar39 * fVar12 + fVar10 * fVar25;
    output_buffer[6] =
         fVar64 * fVar43 + fVar50 * fVar41 + fVar33 * fVar11 + fVar19 * fVar9 +
         fVar42 * fVar57 + fVar40 * fVar12 + fVar10 * fVar26;
    *output_buffer =
         fVar58 * fVar43 + fVar44 * fVar41 + fVar27 * fVar11 + fVar13 * fVar9 +
         fVar51 * fVar42 + fVar34 * fVar12 + fVar20 * fVar10;
    output_buffer[1] =
         fVar59 * fVar43 + fVar45 * fVar41 + fVar28 * fVar11 + fVar14 * fVar9 +
         fVar52 * fVar42 + fVar35 * fVar12 + fVar21 * fVar10;
    output_buffer[2] =
         fVar60 * fVar43 + fVar46 * fVar41 + fVar29 * fVar11 + fVar15 * fVar9 +
         fVar53 * fVar42 + fVar36 * fVar12 + fVar22 * fVar10;
    output_buffer[3] =
         fVar61 * fVar43 + fVar47 * fVar41 + fVar30 * fVar11 + fVar16 * fVar9 +
         fVar54 * fVar42 + fVar37 * fVar12 + fVar23 * fVar10;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 7;
    pfVar65 = pfVar65 + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_7_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  stbir__3_coeff_setup();
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    stbir__3_coeff_remnant(4);
    stbir__store_output();
  } while ( output < output_end );
}